

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_event_decoder.c
# Opt level: O0

int pt_evt_apply_header_cbr(pt_time *time,pt_time_cal *tcal,pt_packet_cbr *packet,pt_config *config)

{
  int errcode;
  pt_config *config_local;
  pt_packet_cbr *packet_local;
  pt_time_cal *tcal_local;
  pt_time *time_local;
  
  if (packet == (pt_packet_cbr *)0x0) {
    time_local._4_4_ = -1;
  }
  else {
    time_local._4_4_ = pt_tcal_header_cbr(tcal,packet,config);
    if (((-1 < time_local._4_4_) || (time_local._4_4_ == -10)) &&
       ((time_local._4_4_ = pt_time_update_cbr(time,packet,config), -1 < time_local._4_4_ ||
        (time_local._4_4_ == -10)))) {
      time_local._4_4_ = 0;
    }
  }
  return time_local._4_4_;
}

Assistant:

static int pt_evt_apply_header_cbr(struct pt_time *time,
				   struct pt_time_cal *tcal,
				   const struct pt_packet_cbr *packet,
				   const struct pt_config *config)
{
	int errcode;

	if (!packet)
		return -pte_internal;

	/* We ignore configuration errors.  They will result in imprecise
	 * calibration which will result in imprecise cycle-accurate timing.
	 */
	errcode = pt_tcal_header_cbr(tcal, packet, config);
	if ((errcode < 0) && (errcode != -pte_bad_config))
		return errcode;

	/* We ignore configuration errors.  They will result in imprecise
	 * timing and are tracked as packet losses in struct pt_time.
	 */
	errcode = pt_time_update_cbr(time, packet, config);
	if ((errcode < 0) && (errcode != -pte_bad_config))
		return errcode;

	return 0;
}